

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmInfo.cpp
# Opt level: O3

GMM_STATUS __thiscall
GmmLib::GmmMultiAdapterContext::AddContext
          (GmmMultiAdapterContext *this,PLATFORM Platform,void *_pSkuTable,void *_pWaTable,
          void *_pGtSysInfo,ADAPTER_BDF sBdf,GMM_CLIENT ClientType)

{
  int iVar1;
  GMM_STATUS GVar2;
  GMM_ADAPTER_INFO *pGVar3;
  Context *pCVar4;
  int32_t *Ref;
  bool bVar5;
  GMM_STATUS local_34;
  
  if (_pGtSysInfo == (void *)0x0 || (_pWaTable == (void *)0x0 || _pSkuTable == (void *)0x0)) {
    return GMM_ERROR;
  }
  pthread_mutex_lock((pthread_mutex_t *)&this->MAContextSyncMutex);
  for (pGVar3 = this->pHeadNode; pGVar3 != (GMM_ADAPTER_INFO *)0x0; pGVar3 = pGVar3->pNext) {
    pCVar4 = pGVar3->pGmmLibContext;
    if ((((pCVar4->sBdf).field_0.Data ^ (uint)sBdf.field_0) & 0xffffff) == 0) {
      LOCK();
      pCVar4->RefCount = pCVar4->RefCount + 1;
      UNLOCK();
      local_34 = GMM_SUCCESS;
      goto LAB_001b0465;
    }
  }
  pGVar3 = AddAdapterNode(this);
  local_34 = GMM_ERROR;
  if (pGVar3 != (GMM_ADAPTER_INFO *)0x0) {
    pCVar4 = (Context *)malloc(14000);
    if (pCVar4 != (Context *)0x0) {
      memset(&pCVar4->ClientType,0,0x35e4);
      pCVar4->AllowedPaddingFor64KbPagesPercentage = 10;
      pCVar4->InternalGpuVaMax = 0;
      pCVar4->AllowedPaddingFor64KBTileSurf = 10;
      (pCVar4->SyncMutex).__align = 0;
      *(undefined8 *)((long)&pCVar4->SyncMutex + 8) = 0;
      *(undefined8 *)((long)&pCVar4->SyncMutex + 0x10) = 0;
      (pCVar4->SyncMutex).__data.__list.__prev = (__pthread_internal_list *)0x0;
      (pCVar4->SyncMutex).__data.__list.__next = (__pthread_internal_list *)0x0;
      pCVar4->RefCount = 0;
      LOCK();
      pCVar4->RefCount = pCVar4->RefCount + 1;
      UNLOCK();
      GVar2 = Context::InitContext
                        (pCVar4,&Platform,(SKU_FEATURE_TABLE *)_pSkuTable,(WA_TABLE *)_pWaTable,
                         (GT_SYSTEM_INFO *)_pGtSysInfo,ClientType);
      if (GVar2 == GMM_SUCCESS) {
        (pCVar4->sBdf).field_0.field_0 =
             (anon_struct_4_4_a1e812c5_for_anon_union_4_2_d56df3a2_for__ADAPTER_BDF__0_0)
             sBdf.field_0;
        pGVar3->pGmmLibContext = pCVar4;
        local_34 = GMM_SUCCESS;
        goto LAB_001b0465;
      }
      do {
        iVar1 = pCVar4->RefCount;
        if (iVar1 < 1) break;
        LOCK();
        bVar5 = iVar1 == pCVar4->RefCount;
        if (bVar5) {
          pCVar4->RefCount = iVar1 + -1;
        }
        UNLOCK();
      } while (!bVar5);
      Context::DestroyContext(pCVar4);
      pthread_mutex_destroy((pthread_mutex_t *)&pCVar4->SyncMutex);
      free(pCVar4);
    }
    RemoveAdapterNode(this,pGVar3);
  }
LAB_001b0465:
  pthread_mutex_unlock((pthread_mutex_t *)&this->MAContextSyncMutex);
  return local_34;
}

Assistant:

GMM_STATUS GMM_STDCALL GmmLib::GmmMultiAdapterContext::AddContext(const PLATFORM Platform,
                                                                  const void    *_pSkuTable,
                                                                  const void    *_pWaTable,
                                                                  const void    *_pGtSysInfo,
                                                                  ADAPTER_BDF    sBdf,
                                                                  const GMM_CLIENT ClientType)
#endif
{
    __GMM_ASSERTPTR(_pSkuTable, GMM_ERROR);
    __GMM_ASSERTPTR(_pWaTable, GMM_ERROR);
    __GMM_ASSERTPTR(_pGtSysInfo, GMM_ERROR);

    GMM_STATUS                Status = GMM_SUCCESS;
    SKU_FEATURE_TABLE        *pSkuTable;
    WA_TABLE                 *pWaTable;
    GT_SYSTEM_INFO           *pSysInfo;
    GMM_LIB_CONTEXT          *pGmmLibContext = NULL;
    GmmLib::GMM_ADAPTER_INFO *pNode          = NULL;

    pSkuTable = (SKU_FEATURE_TABLE *)_pSkuTable;
    pWaTable  = (WA_TABLE *)_pWaTable;
    pSysInfo  = (GT_SYSTEM_INFO *)_pGtSysInfo;

    GMM_STATUS SyncLockStatus = LockMAContextSyncMutex();
    if (SyncLockStatus != GMM_SUCCESS)
    {
        return SyncLockStatus;
    }

    // see if a context with the given BDF already exists
    pNode = GetAdapterNodeUnlocked(sBdf);

    if (pNode)
    {
        // The requested adapter context already exists. increment the reference count.
        // No further initialization needed.
        pNode->pGmmLibContext->IncrementRefCount();
        UnLockMAContextSyncMutex();
        return GMM_SUCCESS;
    }

    // No context exists for this bdf. Add a new node to store the context.
    pNode = AddAdapterNode();
    if (pNode == NULL)
    {
        UnLockMAContextSyncMutex();
        return GMM_ERROR;
    }

    // No context for this adapter yet, Lets create a new LibContext
    pGmmLibContext = new GMM_LIB_CONTEXT();
    if (pGmmLibContext == NULL)
    {
        RemoveAdapterNode(pNode);
        pNode = NULL;
        UnLockMAContextSyncMutex();
        return GMM_ERROR;
    }

    pGmmLibContext->IncrementRefCount();

    Status = (pGmmLibContext->InitContext(Platform, pSkuTable, pWaTable, pSysInfo, ClientType));
    if (Status != GMM_SUCCESS)
    {
        //clean everything and return error
        pGmmLibContext->DecrementRefCount();
        pGmmLibContext->DestroyContext();
        // Delete/free the LibContext object
        delete pGmmLibContext;
        RemoveAdapterNode(pNode);
        UnLockMAContextSyncMutex();
        return GMM_ERROR;
    }

#if LHDM
    // Initialize SingletonContext Data.
    // TBD: ProcessHeap creation requires size and GfxAddress parameters. These parameters are constants
    // and are given by GMM lib internally by PageTableMgr. Hence pHeapObj should be created here at the
    // time of SingletonContext creation. But untill all UMD clients have moved to GMM DLL, then we will
    // create this here.
    pGmmLibContext->pHeapObj           = NULL;
    pGmmLibContext->ProcessHeapCounter = 0;

    // TBD: ProcessVA Gfx partition should be created here using VirtualAlloc at the time of SingletonContext
    // creation. But untill all UMD clients have moved to GMM DLL, then we will
    // create this here.
    pGmmLibContext->ProcessVA        = {0};
    pGmmLibContext->ProcessVACounter = 0;

    pGmmLibContext->IsSVMReserved      = 0;
    pGmmLibContext->NullCCSTileAddress = 0;
#endif

    pGmmLibContext->sBdf = sBdf;

    pNode->pGmmLibContext = pGmmLibContext;


    UnLockMAContextSyncMutex();

    return GMM_SUCCESS;
}